

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.h
# Opt level: O0

InProcCodeGenAllocators * __thiscall
NativeCodeGenerator::EnsureForegroundAllocators
          (NativeCodeGenerator *this,PageAllocator *pageAllocator)

{
  code *pcVar1;
  bool bVar2;
  JITManager *this_00;
  undefined4 *puVar3;
  InProcCodeGenAllocators *pIVar4;
  PageAllocator *pageAllocator_local;
  NativeCodeGenerator *this_local;
  
  this_00 = JITManager::GetJITManager();
  bVar2 = JITManager::IsOOPJITEnabled(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.h"
                       ,0x8d,"(!JITManager::GetJITManager()->IsOOPJITEnabled())",
                       "!JITManager::GetJITManager()->IsOOPJITEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->foregroundAllocators == (InProcCodeGenAllocators *)0x0) {
    pIVar4 = CreateAllocators(this,pageAllocator);
    this->foregroundAllocators = pIVar4;
  }
  return this->foregroundAllocators;
}

Assistant:

InProcCodeGenAllocators *EnsureForegroundAllocators(PageAllocator * pageAllocator)
    {
        Assert(!JITManager::GetJITManager()->IsOOPJITEnabled());
        if (this->foregroundAllocators == nullptr)
        {
            this->foregroundAllocators = CreateAllocators(pageAllocator);

#if !TARGET_64 && _CONTROL_FLOW_GUARD
            if (this->scriptContext->webWorkerId != Js::Constants::NonWebWorkerContextId)
            {
                this->foregroundAllocators->canCreatePreReservedSegment = true;
            }
#endif
        }

        return this->foregroundAllocators;
    }